

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O2

void Dsd_TreePrint2_rec(FILE *pFile,DdManager *dd,Dsd_Node_t *pNode,int fComp,char **pInputNames)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  DdNode *bFunc;
  ulong *puVar5;
  int __c;
  char *pcVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  int iStack_60;
  word uTruth;
  char pCanonPerm [6];
  
  switch(pNode->Type) {
  case DSD_NODE_CONST1:
    fprintf((FILE *)pFile,"Const%d",(ulong)(fComp == 0));
    return;
  case DSD_NODE_BUF:
    pcVar6 = "!";
    if (fComp == 0) {
      pcVar6 = "";
    }
    fputs(pcVar6,(FILE *)pFile);
    fputs(pInputNames[pNode->S->index],(FILE *)pFile);
    return;
  case DSD_NODE_OR:
    pcVar6 = "";
    if (fComp == 0) {
      pcVar6 = "!";
    }
    fputs(pcVar6,(FILE *)pFile);
    fputc(0x28,(FILE *)pFile);
    for (lVar8 = 0; lVar8 < pNode->nDecs; lVar8 = lVar8 + 1) {
      Dsd_TreePrint2_rec(pFile,dd,(Dsd_Node_t *)((ulong)pNode->pDecs[lVar8] & 0xfffffffffffffffe),
                         ~(uint)pNode->pDecs[lVar8] & 1,pInputNames);
    }
    iStack_60 = 0x29;
    break;
  case DSD_NODE_EXOR:
    pcVar6 = "!";
    if (fComp == 0) {
      pcVar6 = "";
    }
    fputs(pcVar6,(FILE *)pFile);
    fputc(0x5b,(FILE *)pFile);
    for (lVar8 = 0; lVar8 < pNode->nDecs; lVar8 = lVar8 + 1) {
      Dsd_TreePrint2_rec(pFile,dd,(Dsd_Node_t *)((ulong)pNode->pDecs[lVar8] & 0xfffffffffffffffe),
                         (uint)pNode->pDecs[lVar8] & 1,pInputNames);
    }
    iStack_60 = 0x5d;
    break;
  case DSD_NODE_PRIME:
    fputc(0x20,(FILE *)pFile);
    if (6 < pNode->nDecs) {
      fprintf((FILE *)pFile,"|%d|");
      fputc(0x7b,(FILE *)pFile);
      for (lVar8 = 0; lVar8 < pNode->nDecs; lVar8 = lVar8 + 1) {
        Dsd_TreePrint2_rec(pFile,dd,(Dsd_Node_t *)((ulong)pNode->pDecs[lVar8] & 0xfffffffffffffffe),
                           (uint)pNode->pDecs[lVar8] & 1,pInputNames);
      }
      fwrite("} ",2,1,(FILE *)pFile);
      return;
    }
    bFunc = Dsd_TreeGetPrimeFunction(dd,pNode);
    uTruth = Dsd_TreeFunc2Truth_rec(dd,bFunc);
    Cudd_Ref(bFunc);
    Cudd_RecursiveDeref(dd,bFunc);
    uVar2 = Abc_TtCanonicize(&uTruth,(int)pNode->nDecs,pCanonPerm);
    uVar3._0_2_ = pNode->nDecs;
    uVar3._2_2_ = pNode->nVisits;
    pcVar6 = "!";
    if ((uint)((uVar2 >> (uVar3 & 0x1f) & 1) != 0) == fComp) {
      pcVar6 = "";
    }
    fputs(pcVar6,(FILE *)pFile);
    uVar1 = pNode->nDecs;
    if ((short)uVar1 < 2) {
      __assert_fail("nVars >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x4dc,"void Abc_TtPrintHexRev(FILE *, word *, int)");
    }
    lVar8 = 1;
    if (6 < uVar1) {
      lVar8 = (long)(1 << ((char)uVar1 - 6U & 0x1f));
    }
    puVar5 = &uTruth + lVar8;
    uVar3 = 0xf;
    if (uVar1 < 6) {
      uVar3 = ~(-1 << ((char)uVar1 - 2U & 0x1f));
    }
    while (puVar5 = puVar5 + -1, iVar7 = uVar3 * 4, uVar9 = uVar3, &uTruth <= puVar5) {
      for (; -1 < (int)uVar9; uVar9 = uVar9 - 1) {
        uVar4 = (uint)(*puVar5 >> ((byte)iVar7 & 0x3f)) & 0xf;
        __c = uVar4 + 0x30;
        if (9 < uVar4) {
          __c = uVar4 + 0x37;
        }
        fputc(__c,(FILE *)pFile);
        iVar7 = iVar7 + -4;
      }
    }
    fputc(0x7b,(FILE *)pFile);
    for (lVar8 = 0; lVar8 < pNode->nDecs; lVar8 = lVar8 + 1) {
      Dsd_TreePrint2_rec(pFile,dd,(Dsd_Node_t *)
                                  ((ulong)pNode->pDecs[pCanonPerm[lVar8]] & 0xfffffffffffffffe),
                         (uVar2 >> ((byte)lVar8 & 0x1f) ^ (uint)pNode->pDecs[pCanonPerm[lVar8]]) & 1
                         ,pInputNames);
    }
    fwrite("} ",2,1,(FILE *)pFile);
    return;
  default:
    __assert_fail("pNode->Type == DSD_NODE_BUF || pNode->Type == DSD_NODE_PRIME || pNode->Type == DSD_NODE_OR || pNode->Type == DSD_NODE_EXOR"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/dsd/dsdTree.c"
                  ,0x35d,"void Dsd_TreePrint2_rec(FILE *, DdManager *, Dsd_Node_t *, int, char **)")
    ;
  }
  fputc(iStack_60,(FILE *)pFile);
  return;
}

Assistant:

void Dsd_TreePrint2_rec( FILE * pFile, DdManager * dd, Dsd_Node_t * pNode, int fComp, char * pInputNames[] )
{
    int i;
    if ( pNode->Type == DSD_NODE_CONST1 )
    {
        fprintf( pFile, "Const%d", !fComp );
        return;
    }
    assert( pNode->Type == DSD_NODE_BUF || pNode->Type == DSD_NODE_PRIME || pNode->Type == DSD_NODE_OR || pNode->Type == DSD_NODE_EXOR ); 
//    fprintf( pFile, "%s", (fComp ^ (pNode->Type == DSD_NODE_OR))? "!" : "" );
    if ( pNode->Type == DSD_NODE_BUF )
    {
        fprintf( pFile, "%s", fComp? "!" : "" );
        fprintf( pFile, "%s", pInputNames[pNode->S->index] );
    }
    else if ( pNode->Type == DSD_NODE_PRIME )
    {
        fprintf( pFile, " " );
        if ( pNode->nDecs <= 6 )
        {
            char pCanonPerm[6]; int uCanonPhase;
            // compute truth table
            DdNode * bFunc = Dsd_TreeGetPrimeFunction( dd, pNode );  
            word uTruth = Dsd_TreeFunc2Truth_rec( dd, bFunc );
            Cudd_Ref( bFunc );
            Cudd_RecursiveDeref( dd, bFunc );
            // canonicize truth table
            uCanonPhase = Abc_TtCanonicize( &uTruth, pNode->nDecs, pCanonPerm );
            fprintf( pFile, "%s", (fComp ^ ((uCanonPhase >> pNode->nDecs) & 1)) ? "!" : "" );
            Abc_TtPrintHexRev( pFile, &uTruth, pNode->nDecs );
            fprintf( pFile, "{" );
            for ( i = 0; i < pNode->nDecs; i++ )
            {
                Dsd_Node_t * pInput = pNode->pDecs[(int)pCanonPerm[i]];
                Dsd_TreePrint2_rec( pFile, dd, Dsd_Regular(pInput), Dsd_IsComplement(pInput) ^ ((uCanonPhase>>i)&1), pInputNames );
            }
            fprintf( pFile, "} " );
        }
        else
        {
            fprintf( pFile, "|%d|", pNode->nDecs );
            fprintf( pFile, "{" );
            for ( i = 0; i < pNode->nDecs; i++ )
                Dsd_TreePrint2_rec( pFile, dd, Dsd_Regular(pNode->pDecs[i]), Dsd_IsComplement(pNode->pDecs[i]), pInputNames );
            fprintf( pFile, "} " );
        }
    }
    else if ( pNode->Type == DSD_NODE_OR )
    {
        fprintf( pFile, "%s", !fComp? "!" : "" );
        fprintf( pFile, "(" );
        for ( i = 0; i < pNode->nDecs; i++ )
            Dsd_TreePrint2_rec( pFile, dd, Dsd_Regular(pNode->pDecs[i]), !Dsd_IsComplement(pNode->pDecs[i]), pInputNames );
        fprintf( pFile, ")" );
    }
    else if ( pNode->Type == DSD_NODE_EXOR )
    {
        fprintf( pFile, "%s", fComp? "!" : "" );
        fprintf( pFile, "[" );
        for ( i = 0; i < pNode->nDecs; i++ )
            Dsd_TreePrint2_rec( pFile, dd, Dsd_Regular(pNode->pDecs[i]), Dsd_IsComplement(pNode->pDecs[i]), pInputNames );
        fprintf( pFile, "]" );
    }
}